

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf-2-json-val-req.cpp
# Opt level: O0

void __thiscall
yactfr::internal::JsonIntTypeMappingsFlagsValReq<yactfr::internal::JsonSIntValReq>::_validate
          (JsonIntTypeMappingsFlagsValReq<yactfr::internal::JsonSIntValReq> *this,JsonVal *jsonVal)

{
  bool bVar1;
  JsonObjVal *pJVar2;
  Size SVar3;
  ostream *poVar4;
  TextLocation *pTVar5;
  reference ppVar6;
  type jsonVal_00;
  ostringstream ss_2;
  TextParseError *exc;
  ostringstream ss_1;
  TextParseError *exc_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>_>
  *keyJsonValPair;
  const_iterator __end3;
  const_iterator __begin3;
  JsonObjVal *__range3;
  string local_1c0;
  ostringstream local_1a0 [8];
  ostringstream ss;
  JsonVal *jsonVal_local;
  JsonIntTypeMappingsFlagsValReq<yactfr::internal::JsonSIntValReq> *this_local;
  
  JsonObjValReq::_validate(&this->super_JsonObjValReq,jsonVal);
  if ((this->_allowEmpty & 1U) == 0) {
    pJVar2 = JsonVal::asObj(jsonVal);
    SVar3 = JsonObjVal::size(pJVar2);
    if (SVar3 == 0) {
      std::__cxx11::ostringstream::ostringstream(local_1a0);
      poVar4 = std::operator<<((ostream *)local_1a0,"Expecting at least one ");
      poVar4 = std::operator<<(poVar4,this->_propName);
      std::operator<<(poVar4,'.');
      std::__cxx11::ostringstream::str();
      pTVar5 = JsonVal::loc(jsonVal);
      throwTextParseError(&local_1c0,*pTVar5);
    }
  }
  pJVar2 = JsonVal::asObj(jsonVal);
  __end3 = JsonObjVal::begin_abi_cxx11_(pJVar2);
  keyJsonValPair =
       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>_>
        *)JsonObjVal::end_abi_cxx11_(pJVar2);
  while( true ) {
    bVar1 = std::operator!=(&__end3,(_Self *)&keyJsonValPair);
    if (!bVar1) break;
    ppVar6 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>_>_>
             ::operator*(&__end3);
    jsonVal_00 = std::
                 unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>
                 ::operator*(&ppVar6->second);
    JsonValReq::validate((JsonValReq *)&this->_rangeSetReq,jsonVal_00);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>_>_>
    ::operator++(&__end3);
  }
  return;
}

Assistant:

void _validate(const JsonVal& jsonVal) const override
    {
        try {
            JsonObjValReq::_validate(jsonVal);

            if (!_allowEmpty && jsonVal.asObj().size() < 1) {
                std::ostringstream ss;

                ss << "Expecting at least one " << _propName << '.';
                throwTextParseError(ss.str(), jsonVal.loc());
            }

            for (auto& keyJsonValPair : jsonVal.asObj()) {
                try {
                    _rangeSetReq.validate(*keyJsonValPair.second);
                } catch (TextParseError& exc) {
                    std::ostringstream ss;

                    ss << "In " << _propName << " `" << keyJsonValPair.first << "`:";
                    appendMsgToTextParseError(exc, ss.str(), jsonVal.loc());
                    throw;
                }
            }
        } catch (TextParseError& exc) {
            std::ostringstream ss;

            ss << "Invalid " << _objName << ":";
            appendMsgToTextParseError(exc, ss.str(), jsonVal.loc());
            throw;
        }
    }